

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ant.cpp
# Opt level: O1

void __thiscall
imrt::Ant::Ant(Ant *this,vector<double,_std::allocator<double>_> *w,
              vector<double,_std::allocator<double>_> *Zmin,
              vector<double,_std::allocator<double>_> *Zmax,Collimator *_collimator,
              vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int _max_apertures,
              int _max_intensity,int initial_intensity,int _step_intensity)

{
  int iVar1;
  Plan *this_00;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  (this->ref_intensity).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ref_intensity).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ref_plan).
  super__Vector_base<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ref_intensity).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ref_plan).
  super__Vector_base<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ref_plan).
  super__Vector_base<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->collimator = _collimator;
  this->n_apertures = _max_apertures;
  iVar1 = Collimator::getNbAngles(_collimator);
  this->n_stations = iVar1;
  this->step_intensity = _step_intensity;
  this->max_intensity = _max_intensity;
  this_00 = (Plan *)operator_new(0xd0);
  std::vector<double,_std::allocator<double>_>::vector(&local_48,w);
  std::vector<double,_std::allocator<double>_>::vector(&local_60,Zmin);
  std::vector<double,_std::allocator<double>_>::vector(&local_78,Zmax);
  Plan::Plan(this_00,&local_48,&local_60,&local_78,this->collimator,volumes,this->n_apertures,
             this->max_intensity,initial_intensity,this->step_intensity,-1,0,(char *)0x0);
  this->p = this_00;
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  generateReference(this);
  return;
}

Assistant:

Ant::Ant (vector<double> w, vector<double> Zmin, vector<double> Zmax, Collimator& _collimator,
       vector<Volume>& volumes, int _max_apertures, int _max_intensity, int initial_intensity,
            int _step_intensity): collimator(_collimator), n_apertures(_max_apertures), n_stations(collimator.getNbAngles()),
            max_intensity(_max_intensity), step_intensity(_step_intensity) {
    
    p = new Plan(w, Zmin, Zmax, collimator, volumes, n_apertures, max_intensity, initial_intensity, step_intensity, -1, Station::OPEN_MIN_SETUP);
    generateReference(); //Remove this if intensityLS is used
  }